

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O0

err_t cmdInit(void)

{
  err_t code;
  err_t local_4;
  
  local_4 = verInit();
  if ((((((local_4 == 0) && (local_4 = bsumInit(), local_4 == 0)) &&
        (local_4 = pwdInit(), local_4 == 0)) &&
       ((local_4 = kgInit(), local_4 == 0 && (local_4 = cvcInit(), local_4 == 0)))) &&
      ((local_4 = cvrInit(), local_4 == 0 &&
       ((local_4 = sigInit(), local_4 == 0 && (local_4 = csrInit(), local_4 == 0)))))) &&
     ((local_4 = stampInit(), local_4 == 0 &&
      ((local_4 = esInit(), local_4 == 0 && (local_4 = stInit(), local_4 == 0)))))) {
    local_4 = affixInit();
  }
  return local_4;
}

Assistant:

err_t cmdInit()
{
	err_t code;
	code = verInit();
	ERR_CALL_CHECK(code);
	code = bsumInit();
	ERR_CALL_CHECK(code);
	code = pwdInit();
	ERR_CALL_CHECK(code);
	code = kgInit();
	ERR_CALL_CHECK(code);
	code = cvcInit();
	ERR_CALL_CHECK(code);
	code = cvrInit();
	ERR_CALL_CHECK(code);
	code = sigInit();
	ERR_CALL_CHECK(code);
	code = csrInit();
	ERR_CALL_CHECK(code);
	code = stampInit();
	ERR_CALL_CHECK(code);
	code = esInit();
	ERR_CALL_CHECK(code);
	code = stInit();
	ERR_CALL_CHECK(code);
	code = affixInit();
	ERR_CALL_CHECK(code);
	return code;
}